

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBodyJointLocationsHTC *value)

{
  GenValidUsageXrInstanceInfo *pGVar1;
  bool bVar2;
  NextChainResult NVar3;
  XrResult XVar4;
  ulong uVar5;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var6;
  long lVar7;
  XrResult XVar8;
  uint32_t in_stack_fffffffffffffcfc;
  string local_2f8;
  allocator local_2d1;
  GenValidUsageXrInstanceInfo *local_2d0;
  string local_2c8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar8 = XR_SUCCESS;
  if (value->type != XR_TYPE_BODY_JOINT_LOCATIONS_HTC) {
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrBodyJointLocationsHTC",value->type,
               "VUID-XrBodyJointLocationsHTC-type-type",XR_TYPE_BODY_JOINT_LOCATIONS_HTC,
               "XR_TYPE_BODY_JOINT_LOCATIONS_HTC");
  }
  local_2d0 = instance_info;
  if (!check_pnext) goto LAB_001a4430;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar3 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar3 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2f8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2f8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::string
              ((string *)&local_2f8,"VUID-XrBodyJointLocationsHTC-next-unique",
               (allocator *)&stack0xfffffffffffffcff);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2c8,
               "Multiple structures of the same type(s) in \"next\" chain for XrBodyJointLocationsHTC struct"
               ,&local_2d1);
    CoreValidLogMessage(instance_info,&local_2f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2f8);
LAB_001a43fb:
    std::__cxx11::string::~string((string *)&error_message);
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar3 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrBodyJointLocationsHTC-next-next",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2f8,
               "Invalid structure(s) in \"next\" chain for XrBodyJointLocationsHTC struct \"next\"",
               (allocator *)&stack0xfffffffffffffcff);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001a43fb;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001a4430:
  if (!check_members || XVar8 != XR_SUCCESS) {
    return XVar8;
  }
  if (value->combinedLocationFlags < 0x10) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrBodyJointLocationsHTC",(allocator *)&local_2c8);
    std::__cxx11::string::string
              ((string *)&local_2f8,"confidenceLevel",(allocator *)&valid_ext_structs);
    pGVar1 = local_2d0;
    bVar2 = ValidateXrEnum(local_2d0,command_name,&error_message,&local_2f8,objects_info,
                           value->confidenceLevel);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&error_message);
    if (bVar2) {
      XVar8 = XR_SUCCESS;
      if ((value->jointLocationCount == 0) &&
         (value->jointLocations != (XrBodyJointLocationHTC *)0x0)) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrBodyJointLocationsHTC-jointLocationCount-arraylength",
                   (allocator *)&local_2c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_240,objects_info);
        pGVar1 = local_2d0;
        std::__cxx11::string::string
                  ((string *)&local_2f8,
                   "Structure XrBodyJointLocationsHTC member jointLocationCount is non-optional and must be greater than 0"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(pGVar1,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_240,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_240);
        std::__cxx11::string::~string((string *)&error_message);
        XVar8 = XR_ERROR_VALIDATION_FAILURE;
      }
      if (value->jointLocations == (XrBodyJointLocationHTC *)0x0) {
        if (value->jointLocationCount == 0) {
          return XVar8;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,"VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                   (allocator *)&local_2c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_258,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2f8,
                   "XrBodyJointLocationsHTC contains invalid NULL for XrBodyJointLocationHTC \"jointLocations\" is which not optional since \"jointLocationCount\" is set and must be non-NULL"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(local_2d0,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_258,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        p_Var6 = &local_258;
      }
      else {
        uVar5 = 0xffffffffffffffff;
        lVar7 = 0;
        do {
          uVar5 = uVar5 + 1;
          if (value->jointLocationCount <= uVar5) {
            return XVar8;
          }
          XVar8 = XR_SUCCESS;
          XVar4 = ValidateXrStruct(local_2d0,command_name,objects_info,true,false,
                                   (XrBodyJointLocationHTC *)
                                   ((long)&value->jointLocations->locationFlags + lVar7));
          lVar7 = lVar7 + 0x28;
        } while (XVar4 == XR_SUCCESS);
        std::__cxx11::string::string
                  ((string *)&error_message,"VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                   (allocator *)&local_2c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_270,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2f8,
                   "Structure XrBodyJointLocationsHTC member jointLocations is invalid",
                   (allocator *)&valid_ext_structs);
        CoreValidLogMessage(local_2d0,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_270,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        p_Var6 = &local_270;
      }
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(p_Var6);
      std::__cxx11::string::~string((string *)&error_message);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrBodyJointLocationsHTC contains invalid XrBodyJointConfidenceHTC \"confidenceLevel\" enum value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
    std::operator<<((ostream *)&error_message,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::string
              ((string *)&local_2f8,"VUID-XrBodyJointLocationsHTC-confidenceLevel-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_228,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(pGVar1,&local_2f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_228,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    p_Var6 = &local_228;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "XrBodyJointLocationsHTC invalid member XrSpaceLocationFlags \"combinedLocationFlags\" flag value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
    std::operator<<((ostream *)&error_message,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::operator<<((ostream *)&error_message," contains illegal bit");
    std::__cxx11::string::string
              ((string *)&local_2f8,"VUID-XrBodyJointLocationsHTC-combinedLocationFlags-parameter",
               (allocator *)&valid_ext_structs);
    pGVar1 = local_2d0;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(pGVar1,&local_2f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    p_Var6 = &local_210;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var6);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBodyJointLocationsHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_BODY_JOINT_LOCATIONS_HTC) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrBodyJointLocationsHTC",
                             value->type, "VUID-XrBodyJointLocationsHTC-type-type", XR_TYPE_BODY_JOINT_LOCATIONS_HTC, "XR_TYPE_BODY_JOINT_LOCATIONS_HTC");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrBodyJointLocationsHTC struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrBodyJointLocationsHTC : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrBodyJointLocationsHTC struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->combinedLocationFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationsHTC invalid member XrSpaceLocationFlags \"combinedLocationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->combinedLocationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-combinedLocationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrBodyJointConfidenceHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrBodyJointLocationsHTC", "confidenceLevel", objects_info, value->confidenceLevel)) {
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationsHTC contains invalid XrBodyJointConfidenceHTC \"confidenceLevel\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->confidenceLevel));
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-confidenceLevel-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->jointLocationCount && nullptr != value->jointLocations) {
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-jointLocationCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrBodyJointLocationsHTC member jointLocationCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->jointLocations && 0 != value->jointLocationCount) {
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrBodyJointLocationsHTC contains invalid NULL for XrBodyJointLocationHTC \"jointLocations\" is which not "
                            "optional since \"jointLocationCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->jointLocations) {
        for (uint32_t value_jointlocations_inc = 0; value_jointlocations_inc < value->jointLocationCount; ++value_jointlocations_inc) {
            // Validate that the structure XrBodyJointLocationHTC is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->jointLocations[value_jointlocations_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrBodyJointLocationsHTC member jointLocations is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}